

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_buffer.hpp
# Opt level: O2

UMat * __thiscall CircularBuffer<cv::UMat_*>::pop(CircularBuffer<cv::UMat_*> *this)

{
  uint uVar1;
  uint uVar2;
  UMat *pUVar3;
  uint uVar4;
  
  uVar1 = this->count_of_elements;
  pUVar3 = (UMat *)0x0;
  if (uVar1 != 0) {
    uVar2 = this->first_element_index;
    pUVar3 = this->data[uVar2];
    this->data[uVar2] = (UMat *)0x0;
    uVar4 = uVar2 + 1;
    if (uVar2 == this->count_of_slots - 1) {
      uVar4 = 0;
    }
    this->first_element_index = uVar4;
    this->count_of_elements = uVar1 - 1;
  }
  return pUVar3;
}

Assistant:

T *CircularBuffer<T *>::pop()
{
    //remove first element from buffer and return it to the caller
    if(count_of_elements == 0) {
        return nullptr;
    }

    T *ret = data[first_element_index];
    data[first_element_index] = nullptr;
    if(first_element_index == count_of_slots - 1) {
        first_element_index = 0;
    } else {
        first_element_index++;
    }
    count_of_elements--;
    return ret;
}